

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::metricToString_abi_cxx11_(Args *this,metric_name mn)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  switch(in_EDX) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"f1score",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"f1scoreLabel",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"precisionAtRecall",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"precisionAtRecallLabel",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"recallAtPrecision",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"recallAtPrecisionLabel",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown metric name!",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  return in_RDI;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::f1scoreLabel:
      return "f1scoreLabel";
    case metric_name::precisionAtRecall:
      return "precisionAtRecall";
    case metric_name::precisionAtRecallLabel:
      return "precisionAtRecallLabel";
    case metric_name::recallAtPrecision:
      return "recallAtPrecision";
    case metric_name::recallAtPrecisionLabel:
      return "recallAtPrecisionLabel";
  }
  return "Unknown metric name!"; // should never happen
}